

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O0

void multifast_rep_flush(AC_TRIE_t *thiz,int keep)

{
  int in_ESI;
  undefined8 *in_RDI;
  MF_REPLACEMENT_DATA_t *unaff_retaddr;
  
  if (in_ESI == 0) {
    mf_repdata_do_replace(unaff_retaddr,(size_t)in_RDI);
  }
  mf_repdata_flush((MF_REPLACEMENT_DATA_t *)0x115ca9);
  if (in_ESI == 0) {
    mf_repdata_reset((MF_REPLACEMENT_DATA_t *)(in_RDI + 8));
    in_RDI[4] = *in_RDI;
    in_RDI[5] = 0;
  }
  return;
}

Assistant:

void multifast_rep_flush (AC_TRIE_t *thiz, int keep)
{
    if (!keep)
    {
        mf_repdata_do_replace (&thiz->repdata, thiz->base_position);
    }
    
    mf_repdata_flush (&thiz->repdata);
    
    if (!keep)
    {
        mf_repdata_reset (&thiz->repdata);
        thiz->last_node = thiz->root;
        thiz->base_position = 0;
    }
}